

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O2

float3 tinyusdz::geometric_normal(float3 *p0,float3 *p1,float3 *p2)

{
  float3 fVar1;
  float3 local_48;
  float3 local_38;
  float3 local_28;
  
  local_38 = operator-(p1,p0);
  local_48 = operator-(p2,p0);
  local_28 = vcross(&local_38,&local_48);
  fVar1 = vnormalize(&local_28,1.1920929e-07);
  return (float3)fVar1._M_elems;
}

Assistant:

value::float3 geometric_normal(const value::float3 &p0, const value::float3 &p1, const value::float3 &p2)
{
  value::float3 n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}